

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O0

permonst * muse_newcham_mon(monst *mon)

{
  obj *poVar1;
  permonst *ppVar2;
  obj *m_armr;
  monst *mon_local;
  
  poVar1 = which_armor(mon,1);
  if (poVar1 != (obj *)0x0) {
    if ((0x5e < poVar1->otyp) && (poVar1->otyp < 0x6a)) {
      return mons + (poVar1->otyp + 0x34);
    }
    if ((0x53 < poVar1->otyp) && (poVar1->otyp < 0x5f)) {
      return mons + (poVar1->otyp + 0x3f);
    }
  }
  ppVar2 = rndmonst(mon->dlevel);
  return ppVar2;
}

Assistant:

static const struct permonst *muse_newcham_mon(struct monst *mon)
{
	struct obj *m_armr;

	if ((m_armr = which_armor(mon, W_ARM)) != 0) {
	    if (Is_dragon_scales(m_armr->otyp))
		return Dragon_scales_to_pm(m_armr);
	    else if (Is_dragon_mail(m_armr->otyp))
		return Dragon_mail_to_pm(m_armr);
	}
	return rndmonst(mon->dlevel);
}